

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Message
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  Descriptor *pDVar1;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *descriptor;
  long lVar5;
  ulong uVar6;
  long lVar7;
  string_view element_name;
  string_view element_name_00;
  
  if (0 < message->nested_type_count_) {
    lVar5 = 0;
    lVar7 = 0;
    do {
      pDVar1 = message->nested_types_;
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                            (int)lVar7);
      ValidateProto3Message(this,(Descriptor *)(&pDVar1->super_SymbolBase + lVar5),proto_00);
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0xa0;
    } while (lVar7 < message->nested_type_count_);
  }
  if (0 < message->field_count_) {
    lVar5 = 0;
    lVar7 = 0;
    do {
      pFVar2 = message->fields_;
      pVVar4 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,(int)lVar7);
      ValidateProto3Field(this,(FieldDescriptor *)(&pFVar2->super_SymbolBase + lVar5),pVVar4);
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0x58;
    } while (lVar7 < message->field_count_);
  }
  if (0 < message->extension_count_) {
    lVar5 = 0;
    lVar7 = 0;
    do {
      pFVar2 = message->extensions_;
      pVVar4 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,(int)lVar7)
      ;
      ValidateProto3Field(this,(FieldDescriptor *)(&pFVar2->super_SymbolBase + lVar5),pVVar4);
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0x58;
    } while (lVar7 < message->extension_count_);
  }
  if (0 < message->extension_range_count_) {
    pcVar3 = (message->all_names_).payload_;
    uVar6 = (ulong)*(ushort *)(pcVar3 + 2);
    descriptor = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                           (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,0);
    element_name._M_str = pcVar3 + ~uVar6;
    element_name._M_len = uVar6;
    AddError(this,element_name,&descriptor->super_Message,NUMBER,
             "Extension ranges are not allowed in proto3.");
  }
  if ((message->options_->field_0)._impl_.message_set_wire_format_ == true) {
    pcVar3 = (message->all_names_).payload_;
    element_name_00._M_len = (ulong)*(ushort *)(pcVar3 + 2);
    element_name_00._M_str = pcVar3 + ~element_name_00._M_len;
    AddError(this,element_name_00,&proto->super_Message,NAME,
             "MessageSet is not supported in proto3.");
    return;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Message(const Descriptor* message,
                                              const DescriptorProto& proto) {
  for (int i = 0; i < message->nested_type_count(); ++i) {
    ValidateProto3Message(message->nested_types_ + i, proto.nested_type(i));
  }
  for (int i = 0; i < message->field_count(); ++i) {
    ValidateProto3Field(message->fields_ + i, proto.field(i));
  }
  for (int i = 0; i < message->extension_count(); ++i) {
    ValidateProto3Field(message->extensions_ + i, proto.extension(i));
  }
  if (message->extension_range_count() > 0) {
    AddError(message->full_name(), proto.extension_range(0),
             DescriptorPool::ErrorCollector::NUMBER,
             "Extension ranges are not allowed in proto3.");
  }
  if (message->options().message_set_wire_format()) {
    // Using MessageSet doesn't make sense since we disallow extensions.
    AddError(message->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "MessageSet is not supported in proto3.");
  }
}